

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_stricmp(char *s1,char *s2)

{
  int iVar1;
  int iVar2;
  int local_2c;
  nk_int d;
  nk_int c2;
  nk_int c1;
  char *s2_local;
  char *s1_local;
  
  _c2 = s2;
  s2_local = s1;
  while( true ) {
    iVar1 = (int)*s2_local;
    iVar2 = (int)*_c2;
    local_2c = iVar1 - iVar2;
    if (((local_2c != 0) &&
        (((0x5a < iVar1 || (iVar1 < 0x41)) || (local_2c = local_2c + 0x20, local_2c != 0)))) &&
       (((0x5a < iVar2 || (iVar2 < 0x41)) || (local_2c = local_2c + -0x20, local_2c != 0)))) break;
    _c2 = _c2 + 1;
    s2_local = s2_local + 1;
    if (iVar1 == 0) {
      return 0;
    }
  }
  return (uint)(-1 < local_2c) * 2 + -1;
}

Assistant:

NK_API int
nk_stricmp(const char *s1, const char *s2)
{
    nk_int c1,c2,d;
    do {
        c1 = *s1++;
        c2 = *s2++;
        d = c1 - c2;
        while (d) {
            if (c1 <= 'Z' && c1 >= 'A') {
                d += ('a' - 'A');
                if (!d) break;
            }
            if (c2 <= 'Z' && c2 >= 'A') {
                d -= ('a' - 'A');
                if (!d) break;
            }
            return ((d >= 0) << 1) - 1;
        }
    } while (c1);
    return 0;
}